

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

matrix4 * matrix4_translatev3(matrix4 *self,vector3 *translation)

{
  matrix4 *pmVar1;
  undefined1 local_98 [8];
  matrix4 translationMatrix;
  vector3 *translation_local;
  matrix4 *self_local;
  
  translationMatrix.field_0.m[0xf] = (double)translation;
  pmVar1 = matrix4_make_transformation_translationv3((matrix4 *)local_98,translation);
  pmVar1 = matrix4_multiply(self,pmVar1);
  return pmVar1;
}

Assistant:

HYPAPI struct matrix4 *matrix4_translatev3(struct matrix4 *self, const struct vector3 *translation)
{
	struct matrix4 translationMatrix;

	return matrix4_multiply(self,
		matrix4_make_transformation_translationv3(&translationMatrix, translation));
}